

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPM_CC_Array_Unmarshal(TPM_CC *target,BYTE **buffer,INT32 *size,INT32 count)

{
  TPM_RC TVar1;
  int local_34;
  INT32 i;
  TPM_RC result;
  INT32 count_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPM_CC *target_local;
  
  local_34 = 0;
  while( true ) {
    if (count <= local_34) {
      return 0;
    }
    TVar1 = UINT32_Unmarshal(target + local_34,buffer,size);
    if (TVar1 != 0) break;
    local_34 = local_34 + 1;
  }
  return TVar1;
}

Assistant:

TPM_RC
TPM_CC_Array_Unmarshal(TPM_CC *target, BYTE **buffer, INT32 *size, INT32 count)
{
    TPM_RC    result;
    INT32 i;
    for(i = 0; i < count; i++) {
        result = TPM_CC_Unmarshal(&target[i], buffer, size);
        if(result != TPM_RC_SUCCESS)
            return result;
    }
    return TPM_RC_SUCCESS;
}